

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicGLSLEarlyFragTests::Run(BasicGLSLEarlyFragTests *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  GLuint GVar8;
  GLint GVar9;
  undefined4 extraout_var;
  void *__s;
  long lVar10;
  int i;
  long lVar11;
  int i_1;
  uint uVar12;
  bool bVar13;
  float local_50 [4];
  float local_40 [4];
  
  iVar7 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)(CONCAT44(extraout_var,iVar7) + 0x18);
  __s = operator_new(0x4000);
  memset(__s,0,0x4000);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  textures = this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,2,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,0x20,0x20,0,0x1908,0x1406,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,0x20,0x20,0,0x1908,0x1406,__s);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  GVar8 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(early_fragment_tests) in;\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) coherent uniform image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, vec4(1.0));\n  o_color = vec4(1.0, 0.0, 0.0, 1.0);\n}"
                     ,(bool *)0x0);
  this->m_program[0] = GVar8;
  GVar8 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) coherent uniform image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, vec4(1.0));\n  o_color = vec4(1.0, 0.0, 0.0, 1.0);\n}"
                     ,(bool *)0x0);
  this->m_program[1] = GVar8;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glViewport(this_00,0,0,0x20,0x20);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glEnable(this_00,0xb71);
  glu::CallLogWrapper::glClearColor(this_00,0.0,1.0,0.0,1.0);
  glu::CallLogWrapper::glClearDepthf(this_00,0.0);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
  GVar9 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program[0],"g_image");
  glu::CallLogWrapper::glUniform1i(this_00,GVar9,0);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
  GVar9 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program[1],"g_image");
  glu::CallLogWrapper::glUniform1i(this_00,GVar9,1);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x1908,0x1406,__s);
  lVar10 = 0;
  do {
    lVar11 = lVar10 * 0x10;
    fVar1 = *(float *)((long)__s + lVar11);
    fVar2 = *(float *)((long)__s + lVar11 + 4);
    fVar3 = *(float *)((long)__s + lVar11 + 8);
    fVar4 = *(float *)((long)__s + lVar11 + 0xc);
    lVar11 = 0;
    do {
      local_40[lVar11] = 1.0;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    bVar5 = false;
    bVar13 = false;
    if (((((fVar1 == local_40[0]) && (bVar13 = bVar5, !NAN(fVar1) && !NAN(local_40[0]))) &&
         (fVar2 == local_40[1])) && ((!NAN(fVar2) && !NAN(local_40[1]) && (fVar3 == local_40[2]))))
       && (!NAN(fVar3) && !NAN(local_40[2]))) {
      bVar13 = fVar4 == local_40[3];
    }
    if ((iVar7 != 0) && (bVar13)) {
      lVar10 = -1;
      goto LAB_009d96a7;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x400);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  uVar12 = 0;
  glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x1908,0x1406,__s);
  bVar13 = true;
  lVar10 = 0;
  do {
    lVar11 = lVar10 * 0x10;
    fVar1 = *(float *)((long)__s + lVar11);
    fVar2 = *(float *)((long)__s + lVar11 + 4);
    fVar3 = *(float *)((long)__s + lVar11 + 8);
    fVar4 = *(float *)((long)__s + lVar11 + 0xc);
    lVar11 = 0;
    do {
      local_50[lVar11] = 1.0;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    bVar6 = false;
    bVar5 = false;
    if ((((fVar1 == local_50[0]) && (bVar5 = bVar6, !NAN(fVar1) && !NAN(local_50[0]))) &&
        (fVar2 == local_50[1])) &&
       (((!NAN(fVar2) && !NAN(local_50[1]) && (fVar3 == local_50[2])) &&
        (!NAN(fVar3) && !NAN(local_50[2]))))) {
      bVar5 = fVar4 == local_50[3];
    }
    if ((iVar7 != 0) && (!bVar5)) break;
    bVar13 = uVar12 < 0x3ff;
    uVar12 = uVar12 + 1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x400);
  lVar10 = -(ulong)bVar13;
LAB_009d96a7:
  operator_delete(__s,0x4000);
  return lVar10;
}

Assistant:

virtual long Run()
	{
		int ds = m_context.getRenderContext().getRenderTarget().getDepthBits();

		const int		  kSize = 32;
		std::vector<vec4> data(kSize * kSize);

		glGenTextures(2, m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kSize, kSize, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kSize, kSize, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		const char* glsl_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							  "  gl_Position = i_position;" NL "}";
		const char* glsl_early_frag_tests_fs =
			"#version 420 core" NL "layout(early_fragment_tests) in;" NL "layout(location = 0) out vec4 o_color;" NL
			"layout(rgba32f) coherent uniform image2D g_image;" NL "void main() {" NL
			"  ivec2 coord = ivec2(gl_FragCoord.xy);" NL "  imageStore(g_image, coord, vec4(1.0));" NL
			"  o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL "}";
		const char* glsl_fs = "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
							  "layout(rgba32f) coherent uniform image2D g_image;" NL "void main() {" NL
							  "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL "  imageStore(g_image, coord, vec4(1.0));" NL
							  "  o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL "}";
		m_program[0] = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_early_frag_tests_fs);
		m_program[1] = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_fs);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);

		glViewport(0, 0, kSize, kSize);
		glBindVertexArray(m_vao);

		glEnable(GL_DEPTH_TEST);
		glClearColor(0.0, 1.0f, 0.0, 1.0f);
		glClearDepthf(0.0f);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glUseProgram(m_program[0]);
		glUniform1i(glGetUniformLocation(m_program[0], "g_image"), 0);

		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glUniform1i(glGetUniformLocation(m_program[1], "g_image"), 1);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0]);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (IsEqual(data[i], vec4(1.0f)) && ds != 0)
				return ERROR;
		}

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0]);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!IsEqual(data[i], vec4(1.0f)) && ds != 0)
				return ERROR;
		}

		return NO_ERROR;
	}